

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

void helper_fsincos_m68k(CPUM68KState_conflict *env,FPReg_conflict *res0,FPReg_conflict *res1,
                        FPReg_conflict *val)

{
  unkuint10 Var1;
  floatx80 fVar2;
  floatx80 a_00;
  undefined6 uStack_4e;
  undefined6 uStack_3e;
  floatx80 a;
  FPReg_conflict *val_local;
  FPReg_conflict *res1_local;
  FPReg_conflict *res0_local;
  CPUM68KState_conflict *env_local;
  
  Var1 = *(unkuint10 *)val;
  fVar2._10_6_ = 0;
  fVar2._0_10_ = *(unkuint10 *)val;
  fVar2 = floatx80_cos_m68k(fVar2,&env->fp_status);
  (res1->d).low = fVar2.low;
  *(ulong *)&(res1->d).high = CONCAT62(uStack_3e,fVar2.high);
  a_00._10_6_ = 0;
  a_00._0_10_ = Var1;
  fVar2 = floatx80_sin_m68k(a_00,&env->fp_status);
  (res0->d).low = fVar2.low;
  *(ulong *)&(res0->d).high = CONCAT62(uStack_4e,fVar2.high);
  return;
}

Assistant:

void HELPER(fsincos)(CPUM68KState *env, FPReg *res0, FPReg *res1, FPReg *val)
{
    floatx80 a = val->d;
    /*
     * If res0 and res1 specify the same floating-point data register,
     * the sine result is stored in the register, and the cosine
     * result is discarded.
     */
    res1->d = floatx80_cos(a, &env->fp_status);
    res0->d = floatx80_sin(a, &env->fp_status);
}